

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_copyCCtx
                 (ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  ZSTD_buffered_policy_e zbuff;
  ZSTD_strategy ZVar1;
  U32 UVar2;
  void *pvVar3;
  ZSTD_freeFunction p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  undefined4 uVar10;
  U32 UVar11;
  size_t __n;
  ZSTD_matchState_t *dstMatchState;
  ulong pledgedSrcSize_00;
  ZSTD_matchState_t *srcMatchState;
  size_t local_110;
  ZSTD_CCtx_params local_108;
  
  if (srcCCtx->stage == ZSTDcs_init) {
    local_110 = 0;
    pledgedSrcSize_00 = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
    zbuff = srcCCtx->bufferedPolicy;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    p_Var4 = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = p_Var4;
    switchD_01939fa4::default(&local_108,&dstCCtx->requestedParams,0xd8);
    local_108.cParams.windowLog = (srcCCtx->appliedParams).cParams.windowLog;
    local_108.cParams.chainLog = (srcCCtx->appliedParams).cParams.chainLog;
    uVar5 = (srcCCtx->appliedParams).cParams.hashLog;
    uVar6 = (srcCCtx->appliedParams).cParams.searchLog;
    uVar7 = (srcCCtx->appliedParams).cParams.minMatch;
    local_108.cParams.targetLength = (srcCCtx->appliedParams).cParams.targetLength;
    local_108.cParams.strategy = (srcCCtx->appliedParams).cParams.strategy;
    local_108.useBlockSplitter = (srcCCtx->appliedParams).useBlockSplitter;
    local_108.useRowMatchFinder = (srcCCtx->appliedParams).useRowMatchFinder;
    local_108.ldmParams.enableLdm = (srcCCtx->appliedParams).ldmParams.enableLdm;
    local_108.ldmParams.hashLog = (srcCCtx->appliedParams).ldmParams.hashLog;
    local_108.ldmParams.bucketSizeLog = (srcCCtx->appliedParams).ldmParams.bucketSizeLog;
    local_108.ldmParams.minMatchLength = (srcCCtx->appliedParams).ldmParams.minMatchLength;
    local_108.ldmParams.hashRateLog = (srcCCtx->appliedParams).ldmParams.hashRateLog;
    local_108.ldmParams.windowLog = (srcCCtx->appliedParams).ldmParams.windowLog;
    local_108.fParams.noDictIDFlag = 0;
    local_108.maxBlockSize = (srcCCtx->appliedParams).maxBlockSize;
    local_108.cParams.hashLog = uVar5;
    local_108.cParams.searchLog = uVar6;
    local_108.cParams.minMatch = uVar7;
    local_108.fParams._0_8_ = (ulong)(pledgedSrcSize_00 != 0xffffffffffffffff);
    ZSTD_resetCCtx_internal(dstCCtx,&local_108,pledgedSrcSize_00,0,ZSTDcrp_leaveDirty,zbuff);
    (dstCCtx->workspace).tableValidEnd = (dstCCtx->workspace).objectEnd;
    ZVar1 = (srcCCtx->appliedParams).cParams.strategy;
    if (ZVar1 != ZSTD_fast) {
      if ((ZVar1 - ZSTD_greedy < 3) &&
         ((srcCCtx->appliedParams).useRowMatchFinder == ZSTD_ps_enable)) {
        local_110 = 0;
      }
      else {
        local_110 = 4L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
      }
    }
    UVar2 = (srcCCtx->blockState).matchState.hashLog3;
    switchD_01939fa4::default
              ((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable
               ,4L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f));
    switchD_01939fa4::default
              ((dstCCtx->blockState).matchState.chainTable,
               (srcCCtx->blockState).matchState.chainTable,local_110);
    __n = 0;
    if (UVar2 != 0) {
      __n = 4L << ((byte)UVar2 & 0x3f);
    }
    switchD_01939fa4::default
              ((dstCCtx->blockState).matchState.hashTable3,
               (srcCCtx->blockState).matchState.hashTable3,__n);
    pvVar3 = (dstCCtx->workspace).tableEnd;
    if ((dstCCtx->workspace).tableValidEnd < pvVar3) {
      (dstCCtx->workspace).tableValidEnd = pvVar3;
    }
    uVar10 = *(undefined4 *)&(srcCCtx->blockState).matchState.window.field_0x24;
    (dstCCtx->blockState).matchState.window.nbOverflowCorrections =
         (srcCCtx->blockState).matchState.window.nbOverflowCorrections;
    *(undefined4 *)&(dstCCtx->blockState).matchState.window.field_0x24 = uVar10;
    pBVar8 = (srcCCtx->blockState).matchState.window.nextSrc;
    pBVar9 = (srcCCtx->blockState).matchState.window.base;
    UVar2 = (srcCCtx->blockState).matchState.window.dictLimit;
    UVar11 = (srcCCtx->blockState).matchState.window.lowLimit;
    (dstCCtx->blockState).matchState.window.dictBase =
         (srcCCtx->blockState).matchState.window.dictBase;
    (dstCCtx->blockState).matchState.window.dictLimit = UVar2;
    (dstCCtx->blockState).matchState.window.lowLimit = UVar11;
    (dstCCtx->blockState).matchState.window.nextSrc = pBVar8;
    (dstCCtx->blockState).matchState.window.base = pBVar9;
    UVar2 = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    (dstCCtx->blockState).matchState.nextToUpdate = UVar2;
    dstCCtx->dictID = srcCCtx->dictID;
    dstCCtx->dictContentSize = srcCCtx->dictContentSize;
    switchD_01939fa4::default
              ((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x1600);
    return 0;
  }
  return 0xffffffffffffffc4;
}

Assistant:

static size_t ZSTD_copyCCtx_internal(ZSTD_CCtx* dstCCtx,
                            const ZSTD_CCtx* srcCCtx,
                            ZSTD_frameParameters fParams,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{
    RETURN_ERROR_IF(srcCCtx->stage!=ZSTDcs_init, stage_wrong,
                    "Can't copy a ctx that's not in init stage.");
    DEBUGLOG(5, "ZSTD_copyCCtx_internal");
    ZSTD_memcpy(&dstCCtx->customMem, &srcCCtx->customMem, sizeof(ZSTD_customMem));
    {   ZSTD_CCtx_params params = dstCCtx->requestedParams;
        /* Copy only compression parameters related to tables. */
        params.cParams = srcCCtx->appliedParams.cParams;
        assert(srcCCtx->appliedParams.useRowMatchFinder != ZSTD_ps_auto);
        assert(srcCCtx->appliedParams.useBlockSplitter != ZSTD_ps_auto);
        assert(srcCCtx->appliedParams.ldmParams.enableLdm != ZSTD_ps_auto);
        params.useRowMatchFinder = srcCCtx->appliedParams.useRowMatchFinder;
        params.useBlockSplitter = srcCCtx->appliedParams.useBlockSplitter;
        params.ldmParams = srcCCtx->appliedParams.ldmParams;
        params.fParams = fParams;
        params.maxBlockSize = srcCCtx->appliedParams.maxBlockSize;
        ZSTD_resetCCtx_internal(dstCCtx, &params, pledgedSrcSize,
                                /* loadedDictSize */ 0,
                                ZSTDcrp_leaveDirty, zbuff);
        assert(dstCCtx->appliedParams.cParams.windowLog == srcCCtx->appliedParams.cParams.windowLog);
        assert(dstCCtx->appliedParams.cParams.strategy == srcCCtx->appliedParams.cParams.strategy);
        assert(dstCCtx->appliedParams.cParams.hashLog == srcCCtx->appliedParams.cParams.hashLog);
        assert(dstCCtx->appliedParams.cParams.chainLog == srcCCtx->appliedParams.cParams.chainLog);
        assert(dstCCtx->blockState.matchState.hashLog3 == srcCCtx->blockState.matchState.hashLog3);
    }

    ZSTD_cwksp_mark_tables_dirty(&dstCCtx->workspace);

    /* copy tables */
    {   size_t const chainSize = ZSTD_allocateChainTable(srcCCtx->appliedParams.cParams.strategy,
                                                         srcCCtx->appliedParams.useRowMatchFinder,
                                                         0 /* forDDSDict */)
                                    ? ((size_t)1 << srcCCtx->appliedParams.cParams.chainLog)
                                    : 0;
        size_t const hSize =  (size_t)1 << srcCCtx->appliedParams.cParams.hashLog;
        int const h3log = srcCCtx->blockState.matchState.hashLog3;
        size_t const h3Size = h3log ? ((size_t)1 << h3log) : 0;

        ZSTD_memcpy(dstCCtx->blockState.matchState.hashTable,
               srcCCtx->blockState.matchState.hashTable,
               hSize * sizeof(U32));
        ZSTD_memcpy(dstCCtx->blockState.matchState.chainTable,
               srcCCtx->blockState.matchState.chainTable,
               chainSize * sizeof(U32));
        ZSTD_memcpy(dstCCtx->blockState.matchState.hashTable3,
               srcCCtx->blockState.matchState.hashTable3,
               h3Size * sizeof(U32));
    }

    ZSTD_cwksp_mark_tables_clean(&dstCCtx->workspace);

    /* copy dictionary offsets */
    {
        const ZSTD_matchState_t* srcMatchState = &srcCCtx->blockState.matchState;
        ZSTD_matchState_t* dstMatchState = &dstCCtx->blockState.matchState;
        dstMatchState->window       = srcMatchState->window;
        dstMatchState->nextToUpdate = srcMatchState->nextToUpdate;
        dstMatchState->loadedDictEnd= srcMatchState->loadedDictEnd;
    }
    dstCCtx->dictID = srcCCtx->dictID;
    dstCCtx->dictContentSize = srcCCtx->dictContentSize;

    /* copy block state */
    ZSTD_memcpy(dstCCtx->blockState.prevCBlock, srcCCtx->blockState.prevCBlock, sizeof(*srcCCtx->blockState.prevCBlock));

    return 0;
}